

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

void __thiscall cppcms::widgets::select_base::element::element(element *this)

{
  *(byte *)this = *(byte *)this & 0xfe;
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  (this->id)._M_string_length = 0;
  (this->id).field_2._M_local_buf[0] = '\0';
  (this->str_option)._M_dataplus._M_p = (pointer)&(this->str_option).field_2;
  (this->str_option)._M_string_length = 0;
  (this->str_option).field_2._M_local_buf[0] = '\0';
  (this->tr_option).n_ = 0;
  (this->tr_option).c_id_ = (char_type *)0x0;
  (this->tr_option).c_context_ = (char_type *)0x0;
  (this->tr_option).c_plural_ = (char_type *)0x0;
  (this->tr_option).id_._M_dataplus._M_p = (pointer)&(this->tr_option).id_.field_2;
  (this->tr_option).id_._M_string_length = 0;
  (this->tr_option).id_.field_2._M_local_buf[0] = '\0';
  (this->tr_option).context_._M_dataplus._M_p = (pointer)&(this->tr_option).context_.field_2;
  (this->tr_option).context_._M_string_length = 0;
  (this->tr_option).context_.field_2._M_local_buf[0] = '\0';
  (this->tr_option).plural_._M_dataplus._M_p = (pointer)&(this->tr_option).plural_.field_2;
  (this->tr_option).plural_._M_string_length = 0;
  (this->tr_option).plural_.field_2._M_local_buf[0] = '\0';
  (this->d).ptr_ = (_data *)0x0;
  return;
}

Assistant:

select_base::element::element() : need_translation(0)
{
}